

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t (anonymous_namespace)::miniz::mz_zip_heap_write_func
                 (void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  long lVar1;
  long lVar2;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t new_capacity;
  void *pNew_block;
  mz_uint64 new_size;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t local_8;
  
  lVar1 = *(long *)(in_RDI + 0x58);
  if (*(ulong *)(lVar1 + 0x70) < in_RSI + in_RCX) {
    local_58 = in_RSI + in_RCX;
  }
  else {
    local_58 = *(ulong *)(lVar1 + 0x70);
  }
  if (in_RCX == 0) {
    local_8 = 0;
  }
  else {
    if (*(ulong *)(lVar1 + 0x78) < local_58) {
      if (*(ulong *)(lVar1 + 0x78) < 0x40) {
        local_60 = 0x40;
      }
      else {
        local_60 = *(ulong *)(lVar1 + 0x78);
      }
      for (local_50 = local_60; local_50 < local_58; local_50 = local_50 << 1) {
      }
      lVar2 = (**(code **)(in_RDI + 0x30))
                        (*(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(lVar1 + 0x68),1,local_50);
      if (lVar2 == 0) {
        return 0;
      }
      *(long *)(lVar1 + 0x68) = lVar2;
      *(ulong *)(lVar1 + 0x78) = local_50;
    }
    memcpy((void *)(*(long *)(lVar1 + 0x68) + in_RSI),in_RDX,in_RCX);
    *(ulong *)(lVar1 + 0x70) = local_58;
    local_8 = in_RCX;
  }
  return local_8;
}

Assistant:

static size_t mz_zip_heap_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint64 new_size = MZ_MAX(file_ofs + n, pState->m_mem_size);
#ifdef _MSC_VER
  if ((!n) ||
      ((0, sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)))
#else
  if ((!n) ||
      ((sizeof(size_t) == sizeof(mz_uint32)) && (new_size > 0x7FFFFFFF)))
#endif
    return 0;
  if (new_size > pState->m_mem_capacity) {
    void *pNew_block;
    size_t new_capacity = MZ_MAX(64, pState->m_mem_capacity);
    while (new_capacity < new_size)
      new_capacity *= 2;
    if (NULL == (pNew_block = pZip->m_pRealloc(
                     pZip->m_pAlloc_opaque, pState->m_pMem, 1, new_capacity)))
      return 0;
    pState->m_pMem = pNew_block;
    pState->m_mem_capacity = new_capacity;
  }
  memcpy((mz_uint8 *)pState->m_pMem + file_ofs, pBuf, n);
  pState->m_mem_size = (size_t)new_size;
  return n;
}